

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROMHeader.cpp
# Opt level: O0

ROMAddress * __thiscall SNESROMHeader::getInterruptDest(SNESROMHeader *this,EmulationIV vector)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  RomLayout layout;
  uint uVar4;
  ROMAddress *this_00;
  ROMAddress *result;
  uint16_t addr;
  SNESROMHeader *this_local;
  EmulationIV vector_local;
  
  puVar3 = this->m_HeaderData;
  this_local._4_4_ = vector.idx;
  uVar4 = EmulationIV::operator_cast_to_unsigned_int((EmulationIV *)((long)&this_local + 4));
  uVar1 = puVar3[uVar4 * 2 + 0x35];
  puVar3 = this->m_HeaderData;
  uVar4 = EmulationIV::operator_cast_to_unsigned_int((EmulationIV *)((long)&this_local + 4));
  uVar2 = puVar3[uVar4 * 2 + 0x34];
  layout = SNESROMHeader::layout(this);
  this_00 = getROMAddressObject(layout);
  ROMAddress::setROMAddress(this_00,(uint)CONCAT11(uVar1,uVar2));
  return this_00;
}

Assistant:

ROMAddress* SNESROMHeader::getInterruptDest(EmulationIV vector) const {
    uint16_t addr = (m_HeaderData[m_EmulationInterruptVectorIndex + 2*static_cast<unsigned int>(vector) + 1] << 8)
                  | m_HeaderData[m_EmulationInterruptVectorIndex + 2*static_cast<unsigned int>(vector)];

    ROMAddress* result = getROMAddressObject(layout());
    result->setROMAddress(addr);
    return result;
}